

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O0

float xm_amiga_period(float note)

{
  byte bVar1;
  byte bVar2;
  ulong uVar3;
  int32_t p2;
  int32_t p1;
  int8_t octave;
  uint8_t a;
  uint intnote;
  float note_local;
  
  uVar3 = (ulong)note;
  bVar1 = (char)uVar3 + (char)((uint)uVar3 / 0xc << 2) * -3;
  bVar2 = (byte)(int)(note / 12.0 + -2.0);
  p1 = amiga_frequencies[bVar1];
  p2 = amiga_frequencies[(int)(bVar1 + 1)];
  if ((char)bVar2 < '\x01') {
    if ((char)bVar2 < '\0') {
      p1 = p1 << (-bVar2 & 0x1f);
      p2 = p2 << (-bVar2 & 0x1f);
    }
  }
  else {
    p1 = p1 >> (bVar2 & 0x1f);
    p2 = p2 >> (bVar2 & 0x1f);
  }
  return ((note - (float)(uVar3 & 0xffffffff)) * (float)(p2 - p1) + (float)p1) / 1024.0;
}

Assistant:

static float xm_amiga_period(float note) {
	unsigned int intnote = note;
	uint8_t a = intnote % 12;
	int8_t octave = note / 12.f - 2;
	int32_t p1 = amiga_frequencies[a], p2 = amiga_frequencies[a + 1];

	if(octave > 0) {
		p1 >>= octave;
		p2 >>= octave;
	} else if(octave < 0) {
		p1 <<= (-octave);
		p2 <<= (-octave);
	}

	return XM_LERP(p1, p2, note - intnote) / AMIGA_FREQ_SCALE;
}